

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Register.cpp
# Opt level: O1

void __thiscall Register::Register(Register *this,RegisterKind kind,uint32_t num)

{
  this->id = (ushort)(kind << 8) | (ushort)num;
  if (kind < PCR) {
    if (0x1f < num) {
      __assert_fail("num < 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Disasm/Register.cpp"
                    ,0x65,"Register::Register(Reg::RegisterKind, uint32_t)");
    }
  }
  else {
    if (kind != PCR) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Disasm/Register.cpp"
                    ,0x6b,"Register::Register(Reg::RegisterKind, uint32_t)");
    }
    if (1 < num) {
      __assert_fail("num < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Disasm/Register.cpp"
                    ,0x68,"Register::Register(Reg::RegisterKind, uint32_t)");
    }
  }
  return;
}

Assistant:

Register::Register(Reg::RegisterKind kind, uint32_t num) {
  id = (kind << 8) | num;

  // check range:
  switch (kind) {
    case Reg::GPR:
    case Reg::FPR:
    case Reg::VF:
    case Reg::COP0:
    case Reg::VI:
      assert(num < 32);
      break;
    case Reg::PCR:
      assert(num < 2);
      break;
    default:
      assert(false);
  }
}